

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O1

int __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,double> *this,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
          *reduced_cost,int r_size,int bk_min,int bk_max)

{
  int iVar1;
  rc_data *prVar2;
  long lVar3;
  item *piVar4;
  int iVar5;
  size_type sVar6;
  double *pdVar7;
  ulong uVar8;
  __normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item>_>_>
  _Var9;
  solver_failure *this_00;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint *puVar16;
  uint uVar17;
  int *piVar18;
  bool bVar19;
  
  if (r_size < 4) {
LAB_0057d909:
    solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>
              ();
LAB_0057d90e:
    solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>
              ();
  }
  else {
    if (bk_max < bk_min) goto LAB_0057d90e;
    *(int *)(this + 100) = bk_min;
    *(int *)(this + 0x68) = bk_max;
    std::
    vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item>_>
    ::resize((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item>_>
              *)(this + 0x20),(ulong)(uint)r_size);
    iVar5 = shared_subvector::init((shared_subvector *)this,(EVP_PKEY_CTX *)(ulong)(uint)r_size);
    if ((char)iVar5 == '\0') goto LAB_0057d918;
    sVar6 = shared_subvector::emplace((shared_subvector *)this);
    *(size_type *)(this + 0x60) = sVar6;
    if (sVar6 == 0) {
      if (*(long *)(this + 0x40) != *(long *)(this + 0x38)) {
        *(long *)(this + 0x40) = *(long *)(this + 0x38);
      }
      prVar2 = (reduced_cost->_M_t).
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
               ._M_head_impl;
      lVar12 = *(long *)(this + 0x20);
      lVar11 = 0;
      do {
        *(undefined8 *)(lVar12 + lVar11 * 2) = *(undefined8 *)((long)&prVar2->value + lVar11);
        *(undefined4 *)(lVar12 + 0x18 + lVar11 * 2) = *(undefined4 *)((long)&prVar2->id + lVar11);
        iVar5 = *(int *)((long)&prVar2->f + lVar11);
        *(int *)(lVar12 + 0x14 + lVar11 * 2) = iVar5;
        iVar15 = -iVar5;
        if (0 < iVar5) {
          iVar15 = iVar5;
        }
        *(int *)(lVar12 + 0x10 + lVar11 * 2) = iVar15;
        *(undefined4 *)(lVar12 + 0x1c + lVar11 * 2) = 0;
        lVar11 = lVar11 + 0x10;
      } while ((ulong)(uint)r_size << 4 != lVar11);
      shared_subvector::check_index((shared_subvector *)this,0);
      if ((ulong)*(uint *)(this + 0x18) != 0) {
        memset(*(void **)this,0,(ulong)*(uint *)(this + 0x18));
      }
      lVar12 = *(long *)(this + 0x20);
      lVar11 = *(long *)(this + 0x28);
      if (lVar12 != lVar11) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar12,lVar11,(int)LZCOUNT(lVar11 - lVar12 >> 5) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar12,lVar11);
      }
      lVar12 = *(long *)(this + 0x20);
      lVar11 = *(long *)(this + 0x28);
      if (lVar11 - lVar12 != 0) {
        lVar13 = lVar11 - lVar12 >> 5;
        iVar5 = *(int *)(this + 100);
        iVar15 = *(int *)(this + 0x68);
        piVar18 = (int *)(lVar12 + 0x14);
        do {
          if (*piVar18 < 0) {
            iVar1 = piVar18[-1];
            iVar5 = iVar5 + iVar1;
            *(int *)(this + 100) = iVar5;
            iVar15 = iVar15 + iVar1;
            *(int *)(this + 0x68) = iVar15;
          }
          piVar18 = piVar18 + 8;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      *(undefined8 *)(lVar11 + -0x18) = *(undefined8 *)(lVar11 + -0x20);
      iVar5 = (int)((ulong)(lVar11 - lVar12) >> 5);
      if (1 < iVar5) {
        uVar8 = (ulong)(iVar5 - 2);
        pdVar7 = (double *)(lVar12 + uVar8 * 0x20);
        lVar12 = uVar8 + 1;
        do {
          pdVar7[1] = pdVar7[5] + *pdVar7;
          pdVar7 = pdVar7 + -4;
          lVar11 = lVar12 + -1;
          bVar19 = 0 < lVar12;
          lVar12 = lVar11;
        } while (lVar11 != 0 && bVar19);
      }
      if (*(int *)(this + 0x68) == *(int *)(this + 100)) {
        branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::solve_equality
                  ((branch_and_bound_solver<baryonyx::itm::minimize_tag,_double> *)this);
      }
      else {
        branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::solve_inequality
                  ((branch_and_bound_solver<baryonyx::itm::minimize_tag,_double> *)this);
      }
      lVar12 = *(long *)(this + 0x20);
      lVar11 = *(long *)(this + 0x28);
      uVar8 = lVar11 - lVar12;
      if ((int)(uVar8 >> 5) != 0) {
        uVar17 = *(uint *)(this + 0x60);
        lVar13 = *(long *)this;
        lVar3 = *(long *)(this + 8);
        uVar14 = uVar8 >> 5 & 0xffffffff;
        puVar16 = (uint *)(lVar12 + 0x1c);
        uVar10 = uVar17;
        do {
          if ((int)puVar16[-2] < 1) {
            if ((ulong)(lVar3 - lVar13) <= (ulong)uVar17) goto LAB_0057d904;
            bVar19 = *(char *)(lVar13 + (ulong)uVar17) == '\0';
          }
          else {
            if ((ulong)(lVar3 - lVar13) <= (ulong)uVar10) {
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>
                        ();
LAB_0057d904:
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>
                        ();
              goto LAB_0057d909;
            }
            bVar19 = *(char *)(lVar13 + (ulong)uVar10) != '\0';
          }
          *puVar16 = (uint)bVar19;
          uVar17 = uVar17 + 1;
          uVar10 = uVar10 + 1;
          puVar16 = puVar16 + 8;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      if (lVar12 != lVar11) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (lVar12,lVar11,(int)LZCOUNT((long)uVar8 >> 5) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (lVar12,lVar11);
      }
      _Var9 = std::
              __find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_pred<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&)_1_>>
                        (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
      lVar12 = *(long *)(this + 0x20);
      piVar4 = *(item **)(this + 0x28);
      lVar11 = (long)piVar4 - lVar12;
      if (lVar11 != 0) {
        lVar11 = lVar11 >> 5;
        prVar2 = (reduced_cost->_M_t).
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
                 ._M_head_impl;
        lVar13 = 0xc;
        do {
          *(undefined8 *)((long)prVar2 + lVar13 + -0xc) =
               *(undefined8 *)(lVar12 + -0x18 + lVar13 * 2);
          *(undefined4 *)((long)prVar2 + lVar13 + -4) = *(undefined4 *)(lVar12 + lVar13 * 2);
          *(undefined4 *)((long)&prVar2->value + lVar13) = *(undefined4 *)(lVar12 + -4 + lVar13 * 2)
          ;
          lVar13 = lVar13 + 0x10;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      if (_Var9._M_current == piVar4) {
        uVar17 = -(uint)(*(int *)(lVar12 + 0x1c) == 0) | r_size;
      }
      else {
        uVar17 = (int)((ulong)((long)_Var9._M_current - lVar12) >> 5) - 1;
      }
      return uVar17;
    }
  }
  solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>
            ();
LAB_0057d918:
  this_00 = (solver_failure *)__cxa_allocate_exception(0x18);
  solver_failure::solver_failure(this_00,no_solver_available);
  __cxa_throw(this_00,&solver_failure::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int solve(R& reduced_cost, int r_size, int bk_min, int bk_max)
    {
        bx_assert(r_size >= 4);
        bx_assert(bk_min <= bk_max);

        b_min = bk_min;
        b_max = bk_max;

        items.resize(r_size);
        if (!subvector.init(r_size))
            throw solver_failure(solver_error_tag::no_solver_available);

        solution = subvector.emplace();

        bx_assert(solution == 0u);

        nodes.clear();

        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].original_factor = reduced_cost[i].f;
            items[i].factor = std::abs(reduced_cost[i].f);
            items[i].result = 0;
        }

        std::fill_n(
          subvector.element_data(solution), subvector.element_size(), 0);

        std::sort(std::begin(items), std::end(items));

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            if (items[i].original_factor < 0) {
                b_min += items[i].factor;
                b_max += items[i].factor;
            }
        }

        // Compute the inversion of the sum z
        items.back().sum_z = items.back().r;
        for (int i = length(items) - 2; i >= 0; --i)
            items[i].sum_z = items[i + 1].sum_z + items[i].r;

        if (b_max == b_min)
            solve_equality();
        else
            solve_inequality();

        for (int i = 0, e = length(items); i != e; ++i) {
            if (items[i].original_factor > 0)
                items[i].result = subvector[solution + i] == 0 ? 0 : 1;
            else
                items[i].result = subvector[solution + i] == 0 ? 1 : 0;
        }

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].original_factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }